

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O3

int dsk_filecmp(void *p1,void *p2)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  lVar3 = *p1;
  lVar4 = *p2;
  uVar5 = strcmp((char *)(lVar3 + 0x108),(char *)(lVar4 + 0x108));
  if (uVar5 == 0) {
    uVar1 = *(uint *)(lVar3 + 0x214);
    uVar2 = *(uint *)(lVar4 + 0x214);
    uVar5 = 0;
    if (uVar1 != uVar2) {
      if (uVar1 == 0) {
        uVar5 = 0xffffffff;
      }
      else if (uVar2 == 0) {
        uVar5 = 1;
      }
      else {
        uVar5 = (uVar1 < uVar2) - 1 | 1;
      }
    }
  }
  return uVar5;
}

Assistant:

static int dsk_filecmp(const void *p1, const void *p2)
{
  FINFO * const *fp1 = p1; /* declare fp1 as pointer to constant pointer to structure finfo */
  FINFO * const *fp2 = p2;
  int res;
  unsigned v1, v2;

  if ((res = strcmp((*fp1)->no_ver_name, (*fp2)->no_ver_name)) != 0) return (res);

  if ((*fp1)->version == (*fp2)->version) return (0);
#ifndef DOS
  if ((v1 = (*fp1)->version) == 0) return (-1);
  if ((v2 = (*fp2)->version) == 0) return (1);
#endif /* DOS */
  return ((v1 < v2) ? 1 : -1);
}